

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

qint64 __thiscall QRingBuffer::peek(QRingBuffer *this,char *data,qint64 maxLength,qint64 pos)

{
  long lVar1;
  QRingChunk *pQVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  qint64 qVar8;
  
  lVar1 = (this->buffers).d.size;
  if (maxLength == 0 || lVar1 == 0) {
    qVar8 = 0;
  }
  else {
    pQVar2 = (this->buffers).d.ptr;
    lVar7 = 0;
    qVar8 = 0;
    do {
      lVar3 = *(long *)((long)&pQVar2->headOffset + lVar7);
      lVar4 = *(long *)((long)&pQVar2->tailOffset + lVar7) - lVar3;
      lVar6 = pos - lVar4;
      if (pos < lVar4) {
        __n = maxLength - qVar8;
        if (lVar4 - pos < maxLength - qVar8) {
          __n = lVar4 - pos;
        }
        pcVar5 = *(char **)((long)&(pQVar2->chunk).d.ptr + lVar7);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "";
        }
        memcpy(data + qVar8,pcVar5 + lVar3 + pos,__n);
        qVar8 = qVar8 + __n;
        lVar6 = 0;
      }
    } while ((lVar1 * 0x28 + -0x28 != lVar7) &&
            (lVar7 = lVar7 + 0x28, pos = lVar6, qVar8 != maxLength));
  }
  return qVar8;
}

Assistant:

qint64 QRingBuffer::peek(char *data, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    qint64 readSoFar = 0;
    for (const QRingChunk &chunk : buffers) {
        if (readSoFar == maxLength)
            break;

        qint64 blockLength = chunk.size();
        if (pos < blockLength) {
            blockLength = qMin(blockLength - pos, maxLength - readSoFar);
            memcpy(data + readSoFar, chunk.data() + pos, blockLength);
            readSoFar += blockLength;
            pos = 0;
        } else {
            pos -= blockLength;
        }
    }

    return readSoFar;
}